

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O1

void usage(char *cmd)

{
  printf("Usage:  %s [-h] salt [-i|-d|-id] [-t iterations] [-m memory] [-p parallelism] [-l hash length] [-e|-r] [-v (10|13)]\n"
         ,cmd);
  puts("\tPassword is read from stdin");
  puts("Parameters:");
  puts("\tsalt\t\tThe salt to use, at least 8 characters");
  puts("\t-i\t\tUse Argon2i (this is the default)");
  puts("\t-d\t\tUse Argon2d instead of Argon2i");
  puts("\t-id\t\tUse Argon2id instead of Argon2i");
  printf("\t-t N\t\tSets the number of iterations to N (default = %d)\n",3);
  printf("\t-m N\t\tSets the memory usage of 2^N KiB (default %d)\n",0xc);
  printf("\t-p N\t\tSets parallelism to N threads (default %d)\n",1);
  printf("\t-l N\t\tSets hash output length to N bytes (default %d)\n",0x20);
  puts("\t-e\t\tOutput only encoded hash");
  puts("\t-r\t\tOutput only the raw bytes of the hash");
  printf("\t-v (10|13)\tArgon2 version (defaults to the most recent version, currently %x)\n",0x13);
  printf("\t-h\t\tPrint %s usage\n",cmd);
  return;
}

Assistant:

static void usage(const char *cmd) {
    printf("Usage:  %s [-h] salt [-i|-d|-id] [-t iterations] [-m memory] "
           "[-p parallelism] [-l hash length] [-e|-r] [-v (10|13)]\n",
           cmd);
    printf("\tPassword is read from stdin\n");
    printf("Parameters:\n");
    printf("\tsalt\t\tThe salt to use, at least 8 characters\n");
    printf("\t-i\t\tUse Argon2i (this is the default)\n");
    printf("\t-d\t\tUse Argon2d instead of Argon2i\n");
    printf("\t-id\t\tUse Argon2id instead of Argon2i\n");
    printf("\t-t N\t\tSets the number of iterations to N (default = %d)\n",
           T_COST_DEF);
    printf("\t-m N\t\tSets the memory usage of 2^N KiB (default %d)\n",
           LOG_M_COST_DEF);
    printf("\t-p N\t\tSets parallelism to N threads (default %d)\n",
           THREADS_DEF);
    printf("\t-l N\t\tSets hash output length to N bytes (default %d)\n",
           OUTLEN_DEF);
    printf("\t-e\t\tOutput only encoded hash\n");
    printf("\t-r\t\tOutput only the raw bytes of the hash\n");
    printf("\t-v (10|13)\tArgon2 version (defaults to the most recent version, "
           "currently %x)\n", ARGON2_VERSION_NUMBER);
    printf("\t-h\t\tPrint %s usage\n", cmd);
}